

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_resume_data.cpp
# Opt level: O2

add_torrent_params * __thiscall
libtorrent::read_resume_data
          (add_torrent_params *__return_storage_ptr__,libtorrent *this,span<const_char> buffer)

{
  error_code ec_00;
  error_code ec_01;
  system_error *psVar1;
  span<const_char> buffer_00;
  int in_stack_ffffffffffffff90;
  error_code ec;
  bdecode_node rd;
  
  buffer_00.m_ptr = buffer.m_ptr;
  ec.val_ = 0;
  ec._4_4_ = ec._4_4_ & 0xffffff00;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  buffer_00.m_len = (difference_type)&ec;
  bdecode(&rd,this,buffer_00,(error_code *)0x0,(int *)0x64,2000000,in_stack_ffffffffffffff90);
  if (ec.failed_ == true) {
    psVar1 = (system_error *)__cxa_allocate_exception(0x40);
    ec_00.failed_ = ec.failed_;
    ec_00._5_3_ = ec._5_3_;
    ec_00.val_ = ec.val_;
    ec_00.cat_ = ec.cat_;
    boost::system::system_error::system_error(psVar1,ec_00);
    __cxa_throw(psVar1,&boost::system::system_error::typeinfo,
                boost::system::system_error::~system_error);
  }
  read_resume_data(__return_storage_ptr__,&rd,&ec);
  if (ec.failed_ != true) {
    std::
    _Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
    ::~_Vector_base((_Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                     *)&rd);
    return __return_storage_ptr__;
  }
  psVar1 = (system_error *)__cxa_allocate_exception(0x40);
  ec_01.failed_ = ec.failed_;
  ec_01._5_3_ = ec._5_3_;
  ec_01.val_ = ec.val_;
  ec_01.cat_ = ec.cat_;
  boost::system::system_error::system_error(psVar1,ec_01);
  __cxa_throw(psVar1,&boost::system::system_error::typeinfo,
              boost::system::system_error::~system_error);
}

Assistant:

add_torrent_params read_resume_data(span<char const> buffer)
	{
		error_code ec;
		bdecode_node rd = bdecode(buffer, ec);
		if (ec) throw system_error(ec);

		auto ret = read_resume_data(rd, ec);
		if (ec) throw system_error(ec);
		return ret;
	}